

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall OperandSymbol::defineOperand(OperandSymbol *this,TripleSymbol *tri)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->defexp == (PatternExpression *)0x0) && (this->triple == (TripleSymbol *)0x0)) {
    this->triple = tri;
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_38,"Redefining operand",&local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void OperandSymbol::defineOperand(TripleSymbol *tri)

{
  if ((defexp != (PatternExpression *)0)||(triple!=(TripleSymbol *)0))
    throw SleighError("Redefining operand");
  triple = tri;
}